

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O0

string * __thiscall
PigLatinTranslator::translate(string *__return_storage_ptr__,PigLatinTranslator *this,string *text)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr___00;
  ulong uVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string transl_word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  punct_sep_str;
  allocator local_21;
  string *local_20;
  string *text_local;
  PigLatinTranslator *this_local;
  
  local_20 = text;
  text_local = (string *)this;
  this_local = (PigLatinTranslator *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __return_storage_ptr___00 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&transl_word.field_2 + 8);
    separate_punctuation(__return_storage_ptr___00,this,local_20);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](__return_storage_ptr___00,1);
    translate_word((string *)local_70,this,pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&transl_word.field_2 + 8),0);
    std::operator+(&local_90,pvVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&transl_word.field_2 + 8),2);
    std::operator+(__return_storage_ptr__,&local_90,pvVar2);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&transl_word.field_2 + 8));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PigLatinTranslator::translate(const std::string& text) const{

  if( text.empty() ) {
    return "";
  }

  std::vector<std::string> punct_sep_str = separate_punctuation(text);

  std::string transl_word = translate_word(punct_sep_str[1]);

  return punct_sep_str[0] + transl_word + punct_sep_str[2];
}